

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

int channelCount(Header *h)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  
  Imf_3_4::Header::channels();
  p_Var1 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  iVar3 = 0;
  while( true ) {
    Imf_3_4::Header::channels();
    p_Var2 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var1 == p_Var2) break;
    iVar3 = iVar3 + 1;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  return iVar3;
}

Assistant:

int
channelCount (const Header& h)
{
    int channels = 0;
    for (ChannelList::ConstIterator i = h.channels ().begin ();
         i != h.channels ().end ();
         ++i)
    {
        ++channels;
    }
    return channels;
}